

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O1

int mp3_read_hdr(mp3_frame_t *frame)

{
  unsigned_long uVar1;
  int iVar2;
  bv_t bv;
  bv_t bStack_28;
  
  if (frame != (mp3_frame_t *)0x0) {
    bv_init(&bStack_28,frame->raw,0x20);
    uVar1 = bv_get_bits(&bStack_28,0xb);
    iVar2 = 0;
    if (uVar1 == 0x7ff) {
      uVar1 = bv_get_bits(&bStack_28,2);
      frame->id = (uchar)uVar1;
      iVar2 = 0;
      if ((uchar)uVar1 != '\x01') {
        uVar1 = bv_get_bits(&bStack_28,2);
        frame->layer = (uchar)uVar1;
        if ((uchar)uVar1 == '\x01') {
          iVar2 = 1;
          uVar1 = bv_get_bits(&bStack_28,1);
          frame->protected = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,4);
          frame->bitrate_index = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,2);
          frame->samplerfindex = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,1);
          frame->padding_bit = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,1);
          frame->private_bit = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,2);
          frame->mode = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,2);
          frame->mode_ext = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,1);
          frame->copyright = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,1);
          frame->original = (uchar)uVar1;
          uVar1 = bv_get_bits(&bStack_28,2);
          frame->emphasis = (uchar)uVar1;
          if (frame->protected == '\0') {
            *(undefined2 *)frame->crc = *(undefined2 *)(frame->raw + 4);
          }
          mp3_calc_hdr(frame);
        }
      }
    }
    return iVar2;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x1fa,
                "int mp3_read_hdr(mp3_frame_t *)");
}

Assistant:

int mp3_read_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);

  bv_t bv;
  bv_init(&bv, frame->raw, 4 * 8);

  /*M
    \emph{Header identifaction string.}

   (ISO) The bit string ``\verb|1111 1111 1111|''
  **/
  if (bv_get_bits(&bv, 11) != 0x7FF)
    return 0;

  /*M
    \emph{MPEG Audio version ID.}

   \begin{tabular}{|l|l|}
   00 & MPEG Version 2.5 (later extension of MPEG 2)
   01 & reserved
   10 & MPEG Version 2 (ISO/IEC 13818-3)
   11 & MPEG Version 1 (ISO/IEC 11172-3)
   \hline
   \end{tabular}

   (ISO) two bit to indicate the ID of the algorithm.
  **/
  frame->id = bv_get_bits(&bv, 2);

  if (frame->id == MPEG_VERSION_RESERVED)
    return 0;

  /*M
    \emph{Layer information.}

   (ISO) 2 bits to indicate which layer is used, according to the
   following table

   \begin{tabular}{|l|l|}
   \hline
   11 & Layer I \\
   10 & Layer II \\
   01 & Layer III \\
   00 & reserved \\
   \hline
   \end{tabular}
  **/
  frame->layer = bv_get_bits(&bv, 2);

  /* we can only handle Layer III */
  if (frame->layer != 1)
    return 0;

  /*M
    \emph{Redundancy protection flag.}

   (ISO) One bit to indicate whether redundancy has been added in
   the audio bitstream to facilitate error detection and
   concealment. Equals 1 if no redundancy has been added, 0 if
   redundancy has been added.
  **/
  frame->protected = bv_get_bits(&bv, 1);

  /*M
    \emph{Bitrate information.}

   (ISO) Indicates the bitrate. The all zero value indicates the
   free format condition, in which a fixed bitrate which does not
   need to be in the list can be used. Fixed means that a frame
   contains either N or N+1 slots, depending on the value of the
   padding bit. The bit rate index is an index to a table, which is
   different for the different Layers.

   The bit rate index indicates the total bitrate irrespective of
   the mode (stereo, joint stereo, dual channel, single channel).
   For Layer II, not all combinations of total bitrate and mode
   are allowed. See 3-Annex B, Table 3-B.2 "Layer II BIT ALLOCATION
   TABLES"

   \begin{tabular}{|l|l|l|l|}
   \hline
   bit rate index &   Layer I   &     Layer II  &       Layer III \\
   \hline
   0000   &         free format &   free format  &    free format \\
   0001   &         32 kbps     &   32 kbps   &       32 kbps \\
   0010   &         64 kbps     &   48 kbps   &       40 kbps \\
   0011   &         96 kbps     &   56 kbps   &       48 kbps \\
   0100   &        128 kbps     &   64 kbps   &       56 kbps \\
   0101   &        160 kbps     &   80 kbps   &       64 kbps \\
   0110   &        192 kbps     &   96 kbps   &       80 kbps \\
   0111   &        224 kbps     &  112 kbps   &       96 kbps \\
   1000   &        256 kbps     &  128 kbps   &      112 kbps \\
   1001   &        288 kbps     &  160 kbps   &      128 kbps \\
   1010   &        320 kbps     &  192 kbps   &      160 kbps \\
   1011   &        352 kbps     &  224 kbps   &      192 kbps \\
   1100   &        384 kbps     &  256 kbps   &      224 kbps \\
   1110   &        416 kbps     &  320 kbps   &      256 kbps \\
   1111   &        448 kbps     &  384 kbps   &      320 kbps \\
   \hline
   \end{tabular}

   In order to provide the smallest possible delay and complexity,
   the decoder is not required to support a continuously variable
   bitrate when in Layer I or II. Layer III supports variable
   bitrate by switching the bit rate index. However, in free
   format, fixed bitrate is required.
  **/
  frame->bitrate_index = bv_get_bits(&bv, 4);

  /*M
    \emph{Sampling frequency information.}

   (ISO) Indicates the sampling frequency, according to the
   following table:

   \begin{tabular}{|l|l|l|l|}
   \hline
   Bits & MPEG 1 & MPEG 2 & MPEG 2.5
   \hline
   00 & 44.1 kHz & 22.05 kHz & 11.025 kHz \\
   01 & 48 kHz & 24 kHz & 12 kHz \\
   10 & 32 kHz & 16 kHz & 8 kHz \\
   11 & reserved & reserved & reserved \\
   \hline
   \end{tabular}

   A reset of the decoder is required to change the sampling rate
  **/
  frame->samplerfindex = bv_get_bits(&bv, 2);

  /*M
    \emph{Padding flag.}

   (ISO) If this bit equals '1' the frame contains an additional
   slot to adjust the mean bitrate to the sampling frequency,
   otherwise this bit will be '0'. Padding is only necessary with a
   sampling frequency of 44.1 kHz.
  **/
  frame->padding_bit = bv_get_bits(&bv, 1);

  /*M
    \emph{Private bit.}

   (ISO) Bit for private use. This bit will not be used in the
   future by ISO.
  **/
  frame->private_bit = bv_get_bits(&bv, 1);

  /*M
    \emph{Stereo encoding mode.}

   (ISO) Indicates the mode according to the following table. In
   Layer I and II the joint stereo mode is intensity stereo, in
   Layer III it is intensity stereo and/or ms stereo

   \begin{tabular}{|l|l|}
   \hline
   00 & stereo \\
   01 & joint stereo (intensity stereo and/or ms stereo) \\
   10 & dual channel \\
   11 & single channel \\
   \hline
   \end{tabular}
  **/
  frame->mode = bv_get_bits(&bv, 2);

  /*M
    \emph{Joint Stereo subband division information.}

   (ISO) These bits are used in joint stereo mode. In Layer I and
   II they indicate which subbands are in intensity stereo. All
   other subbands are coded in stereo.

   00 - subbands  4-31 in intensity stereo, bound==4
   01 - subbands  8-31 in intensity stereo, bound==8
   10 - subbands 12-31 in intensity stereo, bound==12
   11 - subbands 16-31 in intensity stereo, bound==16

   In Layer III they indicate which type of join stereo coding
   method is applied. The frequency ranges over which the
   intensity stereo and ms stereo modes are applied are implicit in
   the algorithm. For more information see 2.4.3.4.

                   intensio stereo        ms stereo
   00              off                    off
   01              on                     off
   10              off                    on
   11              on                     on
   **/
  frame->mode_ext = bv_get_bits(&bv, 2);

  /*M
    \emph{Copyright}

   (ISO) If this bit equals 0 there is no copyright on the coded
    bitstream, 1 means copyright protected.
  **/
  frame->copyright = bv_get_bits(&bv, 1);

  /*M
    \emph{Original flag.}

   (ISO) This bit equals 0 if the bitstream is a copy, 1 if it is
   an original.
  **/
  frame->original = bv_get_bits(&bv, 1);

  /*M
    \emph{MPEG Audio emphasis.}

   (ISO) indicates the type of de-emphasis that shall be used.
   \begin{itemize}
   \item 00 - no emphasis
   \item 01 - 50/15 microsec. emphasis
   \item 10 - reserved
   \item 11 - CCITT J.17
   \end{itemize}
  **/
  frame->emphasis = bv_get_bits(&bv, 2);

  if (frame->protected == 0) {
    frame->crc[0] = frame->raw[4];
    frame->crc[1] = frame->raw[5];
  }

  mp3_calc_hdr(frame);

  return 1;
}